

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

EnumVal * __thiscall
flatbuffers::EnumValBuilder::CreateEnumerator(EnumValBuilder *this,string *ev_name)

{
  pointer ppEVar1;
  pointer ppEVar2;
  EnumVal *this_00;
  int64_t _val;
  
  if (this->temp == (EnumVal *)0x0) {
    ppEVar1 = (this->enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (this->enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    this->user_value = ppEVar1 == ppEVar2;
    this_00 = (EnumVal *)operator_new(0xa8);
    if (ppEVar1 == ppEVar2) {
      _val = 0;
    }
    else {
      _val = ppEVar2[-1]->value;
    }
    EnumVal::EnumVal(this_00,ev_name,_val);
    this->temp = this_00;
    return this_00;
  }
  __assert_fail("!temp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0x951,"EnumVal *flatbuffers::EnumValBuilder::CreateEnumerator(const std::string &)"
               );
}

Assistant:

EnumVal *CreateEnumerator(const std::string &ev_name) {
    FLATBUFFERS_ASSERT(!temp);
    auto first = enum_def.vals.vec.empty();
    user_value = first;
    temp = new EnumVal(ev_name, first ? 0 : enum_def.vals.vec.back()->value);
    return temp;
  }